

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

void __thiscall Version_versionMatch_Test::TestBody(Version_versionMatch_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertHelper local_90 [8];
  Message local_88 [8];
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  string versionString;
  Message local_48 [28];
  char local_2c [4];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  uint version;
  Version_versionMatch_Test *this_local;
  
  gtest_ar._12_4_ = libcellml::version();
  local_2c[0] = '\x03';
  local_2c[1] = '\x06';
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((AssertionResult *)local_28,(EqHelper<false> *)"0x000603U","version",local_2c,
             (uint *)&gtest_ar.field_0xc,(uint *)in_R9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(versionString.field_2._M_local_buf + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/version/version.cpp"
               ,8,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(versionString.field_2._M_local_buf + 8),local_48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(versionString.field_2._M_local_buf + 8));
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  libcellml::versionString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((AssertionResult *)local_80,(EqHelper<false> *)"\"0.6.3\"","versionString","0.6.3",
             (char (*) [6])&gtest_ar_1.message_,in_R9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/version/version.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(Version, versionMatch)
{
    unsigned int version = libcellml::version();
    EXPECT_EQ(0x000603U, version);

    std::string versionString = libcellml::versionString();
    EXPECT_EQ("0.6.3", versionString);
}